

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

void __thiscall mau::ProxySession::workerLoop(ProxySession *this)

{
  SetCurrentThreadName("ProxySession:Worker");
  while (((this->Terminated)._M_base._M_i & 1U) == 0) {
    asio::io_context::run
              ((this->super_DeliveryCommonData).Context.
               super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void ProxySession::workerLoop()
{
    SetCurrentThreadName("ProxySession:Worker");

    while (!Terminated) {
        Context->run();
    }
}